

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

void af_latin_metrics_scale_dim(AF_LatinMetrics metrics,AF_Scaler scaler,AF_Dimension dim)

{
  FT_UInt *pFVar1;
  long lVar2;
  undefined8 uVar3;
  AF_LatinBlueRec *pAVar4;
  FT_Long FVar5;
  long lVar6;
  FT_UInt FVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  
  lVar6 = (&scaler->x_scale)[dim != AF_DIMENSION_HORZ];
  lVar2 = (&scaler->x_delta)[dim != AF_DIMENSION_HORZ];
  if ((metrics->axis[dim].org_scale != lVar6) || (metrics->axis[dim].org_delta != lVar2)) {
    metrics->axis[dim].org_scale = lVar6;
    metrics->axis[dim].org_delta = lVar2;
    FVar7 = metrics->axis[1].blue_count;
    if (FVar7 != 0) {
      pAVar4 = metrics->axis[1].blues;
      do {
        if ((pAVar4->flags & 0x10) != 0) goto LAB_0018492b;
        pAVar4 = pAVar4 + 1;
        FVar7 = FVar7 - 1;
      } while (FVar7 != 0);
    }
    pAVar4 = (AF_LatinBlueRec *)0x0;
LAB_0018492b:
    if (pAVar4 != (AF_LatinBlueRec *)0x0) {
      uVar10 = ((metrics->root).globals)->increase_x_height;
      if (uVar10 == 0) {
        lVar12 = 0x28;
      }
      else {
        uVar8 = (uint)(((metrics->root).scaler.face)->size->metrics).x_ppem;
        lVar12 = 0x34;
        if (uVar10 < uVar8) {
          lVar12 = 0x28;
        }
        if (uVar8 < 6) {
          lVar12 = 0x28;
        }
      }
      if (dim == AF_DIMENSION_VERT) {
        lVar9 = (long)(int)lVar6 * (long)(int)(pAVar4->shoot).org;
        uVar11 = (ulong)(int)((ulong)((lVar9 >> 0x3f) + lVar9 + 0x8000) >> 0x10);
        uVar13 = lVar12 + uVar11 & 0xffffffffffffffc0;
        if (uVar13 != uVar11) {
          FVar5 = FT_MulDiv(lVar6,uVar13,uVar11);
          uVar11 = (ulong)metrics->units_per_em;
          uVar13 = (ulong)metrics->axis[1].blue_count;
          if (uVar13 != 0) {
            lVar12 = 0;
            do {
              uVar14 = *(ulong *)((long)&metrics->axis[1].blues[0].ascender + lVar12);
              if ((long)uVar14 < (long)uVar11) {
                uVar14 = uVar11;
              }
              uVar11 = -*(long *)((long)&metrics->axis[1].blues[0].descender + lVar12);
              if ((long)uVar11 < (long)uVar14) {
                uVar11 = uVar14;
              }
              lVar12 = lVar12 + 0x48;
            } while (uVar13 * 0x48 != lVar12);
          }
          lVar12 = (long)((int)FVar5 - (int)lVar6) * (long)(int)uVar11;
          uVar8 = (uint)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10);
          uVar10 = -uVar8;
          if (0 < (int)uVar8) {
            uVar10 = uVar8;
          }
          if (uVar10 < 0x80) {
            lVar6 = FVar5;
          }
        }
      }
    }
    metrics->axis[dim].scale = lVar6;
    metrics->axis[dim].delta = lVar2;
    *(long *)((long)metrics->axis[0].widths + (ulong)(dim != AF_DIMENSION_HORZ) * 8 + -0x58) = lVar6
    ;
    *(long *)((long)(metrics->axis[0].widths + -3) + (ulong)(dim != AF_DIMENSION_HORZ) * 8) = lVar2;
    uVar11 = (ulong)metrics->axis[dim].width_count;
    if (uVar11 != 0) {
      lVar12 = 0;
      do {
        lVar9 = (long)*(int *)((long)&metrics->axis[dim].widths[0].org + lVar12) * (long)(int)lVar6;
        lVar9 = (long)(int)((ulong)(lVar9 + (lVar9 >> 0x3f) + 0x8000) >> 0x10);
        *(long *)((long)&metrics->axis[dim].widths[0].cur + lVar12) = lVar9;
        *(long *)((long)&metrics->axis[dim].widths[0].fit + lVar12) = lVar9;
        lVar12 = lVar12 + 0x18;
      } while (uVar11 * 0x18 != lVar12);
    }
    lVar12 = (long)(int)lVar6;
    lVar6 = (int)metrics->axis[dim].standard_width * lVar12;
    metrics->axis[dim].extra_light = (int)((ulong)(lVar6 + (lVar6 >> 0x3f) + 0x8000) >> 0x10) < 0x28
    ;
    if ((dim == AF_DIMENSION_VERT) && (uVar11 = (ulong)metrics->axis[dim].blue_count, uVar11 != 0))
    {
      lVar6 = 0;
      do {
        uVar3 = *(undefined8 *)((long)&metrics->axis[dim].blues[0].shoot.org + lVar6);
        iVar15 = (int)*(undefined8 *)((long)&metrics->axis[dim].blues[0].ref.org + lVar6);
        lVar9 = iVar15 * lVar12;
        lVar9 = (int)((ulong)(lVar9 + 0x8000 + (lVar9 >> 0x3f)) >> 0x10) + lVar2;
        *(long *)((long)&metrics->axis[dim].blues[0].ref.cur + lVar6) = lVar9;
        *(long *)((long)&metrics->axis[dim].blues[0].ref.fit + lVar6) = lVar9;
        iVar16 = (int)uVar3;
        lVar17 = iVar16 * lVar12;
        lVar17 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10) + lVar2;
        *(long *)((long)&metrics->axis[dim].blues[0].shoot.cur + lVar6) = lVar17;
        *(long *)((long)&metrics->axis[dim].blues[0].shoot.fit + lVar6) = lVar17;
        uVar10 = *(uint *)((long)&metrics->axis[dim].blues[0].flags + lVar6);
        *(uint *)((long)&metrics->axis[dim].blues[0].flags + lVar6) = uVar10 & 0xfffffffe;
        lVar17 = (iVar15 - iVar16) * lVar12;
        iVar15 = (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10);
        if (iVar15 + 0x30U < 0x61) {
          lVar17 = -(long)iVar15;
          if (-1 < iVar15) {
            lVar17 = (long)iVar15;
          }
          lVar18 = 0;
          if (0x1f < lVar17) {
            lVar18 = (ulong)(0x2f < lVar17) * 0x20 + 0x20;
          }
          lVar17 = -lVar18;
          if (iVar15 < 0) {
            lVar17 = lVar18;
          }
          uVar13 = lVar9 + 0x20U & 0xffffffffffffffc0;
          *(ulong *)((long)&metrics->axis[dim].blues[0].ref.fit + lVar6) = uVar13;
          *(ulong *)((long)&metrics->axis[dim].blues[0].shoot.fit + lVar6) = uVar13 + lVar17;
          *(uint *)((long)&metrics->axis[dim].blues[0].flags + lVar6) = uVar10 | 1;
        }
        lVar6 = lVar6 + 0x48;
      } while (uVar11 * 0x48 != lVar6);
      uVar13 = 0;
      do {
        if ((~metrics->axis[dim].blues[uVar13].flags & 5) == 0) {
          lVar6 = 0;
          do {
            if ((((*(uint *)((long)&metrics->axis[dim].blues[0].flags + lVar6) & 5) == 1) &&
                (*(long *)((long)&metrics->axis[dim].blues[0].ref.fit + lVar6) <=
                 metrics->axis[dim].blues[uVar13].shoot.fit)) &&
               (metrics->axis[dim].blues[uVar13].ref.fit <=
                *(long *)((long)&metrics->axis[dim].blues[0].shoot.fit + lVar6))) {
              pFVar1 = &metrics->axis[dim].blues[uVar13].flags;
              *(byte *)pFVar1 = (byte)*pFVar1 & 0xfe;
              break;
            }
            lVar6 = lVar6 + 0x48;
          } while (uVar11 * 0x48 != lVar6);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar11);
    }
  }
  return;
}

Assistant:

static void
  af_latin_metrics_scale_dim( AF_LatinMetrics  metrics,
                              AF_Scaler        scaler,
                              AF_Dimension     dim )
  {
    FT_Fixed      scale;
    FT_Pos        delta;
    AF_LatinAxis  axis;
    FT_UInt       nn;


    if ( dim == AF_DIMENSION_HORZ )
    {
      scale = scaler->x_scale;
      delta = scaler->x_delta;
    }
    else
    {
      scale = scaler->y_scale;
      delta = scaler->y_delta;
    }

    axis = &metrics->axis[dim];

    if ( axis->org_scale == scale && axis->org_delta == delta )
      return;

    axis->org_scale = scale;
    axis->org_delta = delta;

    /*
     * correct X and Y scale to optimize the alignment of the top of small
     * letters to the pixel grid
     */
    {
      AF_LatinAxis  Axis = &metrics->axis[AF_DIMENSION_VERT];
      AF_LatinBlue  blue = NULL;


      for ( nn = 0; nn < Axis->blue_count; nn++ )
      {
        if ( Axis->blues[nn].flags & AF_LATIN_BLUE_ADJUSTMENT )
        {
          blue = &Axis->blues[nn];
          break;
        }
      }

      if ( blue )
      {
        FT_Pos   scaled;
        FT_Pos   threshold;
        FT_Pos   fitted;
        FT_UInt  limit;
        FT_UInt  ppem;


        scaled    = FT_MulFix( blue->shoot.org, scale );
        ppem      = metrics->root.scaler.face->size->metrics.x_ppem;
        limit     = metrics->root.globals->increase_x_height;
        threshold = 40;

        /* if the `increase-x-height' property is active, */
        /* we round up much more often                    */
        if ( limit                                 &&
             ppem <= limit                         &&
             ppem >= AF_PROP_INCREASE_X_HEIGHT_MIN )
          threshold = 52;

        fitted = ( scaled + threshold ) & ~63;

        if ( scaled != fitted )
        {
#if 0
          if ( dim == AF_DIMENSION_HORZ )
          {
            if ( fitted < scaled )
              scale -= scale / 50;  /* scale *= 0.98 */
          }
          else
#endif
          if ( dim == AF_DIMENSION_VERT )
          {
            FT_Pos    max_height;
            FT_Pos    dist;
            FT_Fixed  new_scale;


            new_scale = FT_MulDiv( scale, fitted, scaled );

            /* the scaling should not change the result by more than two pixels */
            max_height = metrics->units_per_em;

            for ( nn = 0; nn < Axis->blue_count; nn++ )
            {
              max_height = FT_MAX( max_height, Axis->blues[nn].ascender );
              max_height = FT_MAX( max_height, -Axis->blues[nn].descender );
            }

            dist  = FT_ABS( FT_MulFix( max_height, new_scale - scale ) );
            dist &= ~127;

            if ( dist == 0 )
            {
              FT_TRACE5((
                "af_latin_metrics_scale_dim:"
                " x height alignment (style `%s'):\n"
                "                           "
                " vertical scaling changed from %.5f to %.5f (by %d%%)\n"
                "\n",
                af_style_names[metrics->root.style_class->style],
                scale / 65536.0,
                new_scale / 65536.0,
                ( fitted - scaled ) * 100 / scaled ));

              scale = new_scale;
            }
#ifdef FT_DEBUG_LEVEL_TRACE
            else
            {
              FT_TRACE5((
                "af_latin_metrics_scale_dim:"
                " x height alignment (style `%s'):\n"
                "                           "
                " excessive vertical scaling abandoned\n"
                "\n",
                af_style_names[metrics->root.style_class->style] ));
            }
#endif
          }
        }
      }
    }

    axis->scale = scale;
    axis->delta = delta;

    if ( dim == AF_DIMENSION_HORZ )
    {
      metrics->root.scaler.x_scale = scale;
      metrics->root.scaler.x_delta = delta;
    }
    else
    {
      metrics->root.scaler.y_scale = scale;
      metrics->root.scaler.y_delta = delta;
    }

    FT_TRACE5(( "%s widths (style `%s')\n",
                dim == AF_DIMENSION_HORZ ? "horizontal" : "vertical",
                af_style_names[metrics->root.style_class->style] ));

    /* scale the widths */
    for ( nn = 0; nn < axis->width_count; nn++ )
    {
      AF_Width  width = axis->widths + nn;


      width->cur = FT_MulFix( width->org, scale );
      width->fit = width->cur;

      FT_TRACE5(( "  %d scaled to %.2f\n",
                  width->org,
                  width->cur / 64.0 ));
    }

    FT_TRACE5(( "\n" ));

    /* an extra-light axis corresponds to a standard width that is */
    /* smaller than 5/8 pixels                                     */
    axis->extra_light =
      (FT_Bool)( FT_MulFix( axis->standard_width, scale ) < 32 + 8 );

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( axis->extra_light )
      FT_TRACE5(( "`%s' style is extra light (at current resolution)\n"
                  "\n",
                  af_style_names[metrics->root.style_class->style] ));
#endif

    if ( dim == AF_DIMENSION_VERT )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( axis->blue_count )
        FT_TRACE5(( "blue zones (style `%s')\n",
                    af_style_names[metrics->root.style_class->style] ));
#endif

      /* scale the blue zones */
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];
        FT_Pos        dist;


        blue->ref.cur   = FT_MulFix( blue->ref.org, scale ) + delta;
        blue->ref.fit   = blue->ref.cur;
        blue->shoot.cur = FT_MulFix( blue->shoot.org, scale ) + delta;
        blue->shoot.fit = blue->shoot.cur;
        blue->flags    &= ~AF_LATIN_BLUE_ACTIVE;

        /* a blue zone is only active if it is less than 3/4 pixels tall */
        dist = FT_MulFix( blue->ref.org - blue->shoot.org, scale );
        if ( dist <= 48 && dist >= -48 )
        {
#if 0
          FT_Pos  delta1;
#endif
          FT_Pos  delta2;


          /* use discrete values for blue zone widths */

#if 0

          /* generic, original code */
          delta1 = blue->shoot.org - blue->ref.org;
          delta2 = delta1;
          if ( delta1 < 0 )
            delta2 = -delta2;

          delta2 = FT_MulFix( delta2, scale );

          if ( delta2 < 32 )
            delta2 = 0;
          else if ( delta2 < 64 )
            delta2 = 32 + ( ( ( delta2 - 32 ) + 16 ) & ~31 );
          else
            delta2 = FT_PIX_ROUND( delta2 );

          if ( delta1 < 0 )
            delta2 = -delta2;

          blue->ref.fit   = FT_PIX_ROUND( blue->ref.cur );
          blue->shoot.fit = blue->ref.fit + delta2;

#else

          /* simplified version due to abs(dist) <= 48 */
          delta2 = dist;
          if ( dist < 0 )
            delta2 = -delta2;

          if ( delta2 < 32 )
            delta2 = 0;
          else if ( delta2 < 48 )
            delta2 = 32;
          else
            delta2 = 64;

          if ( dist < 0 )
            delta2 = -delta2;

          blue->ref.fit   = FT_PIX_ROUND( blue->ref.cur );
          blue->shoot.fit = blue->ref.fit - delta2;

#endif

          blue->flags |= AF_LATIN_BLUE_ACTIVE;
        }
      }

      /* use sub-top blue zone only if it doesn't overlap with */
      /* another (non-sup-top) blue zone; otherwise, the       */
      /* effect would be similar to a neutral blue zone, which */
      /* is not desired here                                   */
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];
        FT_UInt       i;


        if ( !( blue->flags & AF_LATIN_BLUE_SUB_TOP ) )
          continue;
        if ( !( blue->flags & AF_LATIN_BLUE_ACTIVE ) )
          continue;

        for ( i = 0; i < axis->blue_count; i++ )
        {
          AF_LatinBlue  b = &axis->blues[i];


          if ( b->flags & AF_LATIN_BLUE_SUB_TOP )
            continue;
          if ( !( b->flags & AF_LATIN_BLUE_ACTIVE ) )
            continue;

          if ( b->ref.fit <= blue->shoot.fit &&
               b->shoot.fit >= blue->ref.fit )
          {
            blue->flags &= ~AF_LATIN_BLUE_ACTIVE;
            break;
          }
        }
      }

#ifdef FT_DEBUG_LEVEL_TRACE
      for ( nn = 0; nn < axis->blue_count; nn++ )
      {
        AF_LatinBlue  blue = &axis->blues[nn];


        FT_TRACE5(( "  reference %d: %d scaled to %.2f%s\n"
                    "  overshoot %d: %d scaled to %.2f%s\n",
                    nn,
                    blue->ref.org,
                    blue->ref.fit / 64.0,
                    blue->flags & AF_LATIN_BLUE_ACTIVE ? ""
                                                       : " (inactive)",
                    nn,
                    blue->shoot.org,
                    blue->shoot.fit / 64.0,
                    blue->flags & AF_LATIN_BLUE_ACTIVE ? ""
                                                       : " (inactive)" ));
      }
#endif
    }
  }